

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Voice::render(V2Voice *this,StereoSample *dest,int nsamples)

{
  int iVar1;
  float *dest_00;
  float *dest_01;
  float fVar2;
  int local_40;
  float out;
  int i_2;
  float cv;
  int i_1;
  int i;
  float *voice2;
  float *voice;
  int nsamples_local;
  StereoSample *dest_local;
  V2Voice *this_local;
  
  if (nsamples < 0x119) {
    dest_01 = this->inst->vcebuf;
    dest_00 = this->inst->vcebuf2;
    memset(dest_01,0,(long)nsamples << 2);
    for (cv = 0.0; (int)cv < 3; cv = (float)((int)cv + 1)) {
      V2Osc::render(this->osc + (int)cv,dest_01,nsamples);
    }
    iVar1 = this->fmode;
    if (iVar1 == 0) {
      V2Flt::render(this->vcf,dest_01,dest_01,nsamples,1);
    }
    else if ((iVar1 == 1) || (iVar1 != 2)) {
      V2Flt::render(this->vcf,dest_01,dest_01,nsamples,1);
      V2Flt::render(this->vcf + 1,dest_01,dest_01,nsamples,1);
    }
    else {
      V2Flt::render(this->vcf + 1,dest_00,dest_01,nsamples,1);
      V2Flt::render(this->vcf,dest_01,dest_01,nsamples,1);
      for (i_2 = 0; i_2 < nsamples; i_2 = i_2 + 1) {
        dest_01[i_2] = dest_01[i_2] * this->f1gain + dest_00[i_2] * this->f2gain;
      }
    }
    V2Dist::renderMono(&this->dist,dest_01,dest_01,nsamples);
    V2DCFilter::renderMono(&this->dcf,dest_01,dest_01,nsamples);
    out = this->curvol;
    for (local_40 = 0; local_40 < nsamples; local_40 = local_40 + 1) {
      fVar2 = dest_01[local_40] * out;
      out = this->volramp + out;
      dest[local_40].field_0.l = this->lvol * fVar2 + 3.8146973e-06 + dest[local_40].field_0.l;
      *(float *)((long)dest + (long)local_40 * 8 + 4) =
           this->rvol * fVar2 + 3.8146973e-06 + *(float *)((long)dest + (long)local_40 * 8 + 4);
    }
    this->curvol = out;
    return;
  }
  __assert_fail("nsamples <= V2Instance::MAX_FRAME_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                ,0x687,"void V2Voice::render(StereoSample *, int)");
}

Assistant:

void render(StereoSample *dest, int nsamples)
    {
        assert(nsamples <= V2Instance::MAX_FRAME_SIZE);

        // clear voice buffer
        float *voice = inst->vcebuf;
        float *voice2 = inst->vcebuf2;
        memset(voice, 0, nsamples * sizeof(*voice));

        // oscillators -> voice buffer
        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].render(voice, nsamples);

        // voice buffer -> filters -> voice buffer
        switch (fmode)
        {
        case FLTR_SINGLE:
            COVER("VOICE filter single");
            vcf[0].render(voice, voice, nsamples);
            break;

        case FLTR_SERIAL:
        default:
            COVER("VOICE filter serial");
            vcf[0].render(voice, voice, nsamples);
            vcf[1].render(voice, voice, nsamples);
            break;

        case FLTR_PARALLEL:
            COVER("VOICE filter parallel");
            vcf[1].render(voice2, voice, nsamples);
            vcf[0].render(voice, voice, nsamples);
            for (int i=0; i < nsamples; i++)
                voice[i] = voice[i]*f1gain + voice2[i]*f2gain;
            break;
        }

        // voice buffer -> distortion -> voice buffer
        dist.renderMono(voice, voice, nsamples);

        // voice buffer -> dc filter -> voice buffer
        dcf.renderMono(voice, voice, nsamples);

        DEBUG_PLOT(this, voice, nsamples);

        // voice buffer (mono) -> +=output buffer (stereo)
        // original ASM code has chan buffer hardwired as output here
        float cv = curvol;
        for (int i=0; i < nsamples; i++)
        {
            float out = voice[i] * cv;
            cv += volramp;

            dest[i].l += lvol * out + fcdcoffset;
            dest[i].r += rvol * out + fcdcoffset;
        }

        curvol = cv;
    }